

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::setExternalSchemaLocation
          (AbstractDOMParser *this,XMLCh *schemaLocation)

{
  short *psVar1;
  XMLScanner *pXVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t __n;
  XMLCh *__dest;
  
  pXVar2 = this->fScanner;
  (*pXVar2->fMemoryManager->_vptr_MemoryManager[4])
            (pXVar2->fMemoryManager,pXVar2->fExternalSchemaLocation);
  if (schemaLocation == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)schemaLocation + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pXVar2->fMemoryManager->_vptr_MemoryManager[3])(pXVar2->fMemoryManager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memcpy(__dest,schemaLocation,__n);
  }
  pXVar2->fExternalSchemaLocation = __dest;
  return;
}

Assistant:

void AbstractDOMParser::setExternalSchemaLocation(const XMLCh* const schemaLocation)
{
    fScanner->setExternalSchemaLocation(schemaLocation);
}